

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

string * __thiscall
gflags::TheseCommandlineFlagsIntoString_abi_cxx11_
          (string *__return_storage_ptr__,gflags *this,
          vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *flags)

{
  long lVar1;
  string *psVar2;
  ulong *puVar3;
  
  for (lVar1 = *(long *)this; lVar1 != *(long *)(this + 8); lVar1 = lVar1 + 0xd0) {
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  puVar3 = *(ulong **)this;
  if (puVar3 != *(ulong **)(this + 8)) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar3);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,puVar3[0xc]);
      psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      puVar3 = puVar3 + 0x1a;
    } while (puVar3 != *(ulong **)(this + 8));
  }
  return psVar2;
}

Assistant:

static string TheseCommandlineFlagsIntoString(
    const vector<CommandLineFlagInfo>& flags) {
  vector<CommandLineFlagInfo>::const_iterator i;

  size_t retval_space = 0;
  for (i = flags.begin(); i != flags.end(); ++i) {
    // An (over)estimate of how much space it will take to print this flag
    retval_space += i->name.length() + i->current_value.length() + 5;
  }

  string retval;
  retval.reserve(retval_space);
  for (i = flags.begin(); i != flags.end(); ++i) {
    retval += "--";
    retval += i->name;
    retval += "=";
    retval += i->current_value;
    retval += "\n";
  }
  return retval;
}